

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test::TestBody
          (ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test *this)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  byte local_c9;
  void *local_c8;
  undefined8 uStack_c0;
  long local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  lVar1 = 0;
  do {
    local_c8 = (void *)0x0;
    uStack_c0 = 0;
    local_b8 = 0;
    local_c9 = 0;
    if (lVar1 != 0) {
      do {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,&local_c9);
        local_c9 = local_c9 + 1;
      } while (local_c9 < (byte)lVar1);
    }
    ZLIBBufferCompressorTest::TestCompression
              (&local_48,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,0x10000);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ZLIBBufferCompressorTest::TestCompression
              (&local_60,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,8);
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ZLIBBufferCompressorTest::TestCompression
              (&local_78,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,0x10000);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ZLIBBufferCompressorTest::TestCompression
              (&local_90,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,0x10000);
    if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ZLIBBufferCompressorTest::TestCompression
              (&local_a8,&this->super_ZLIBBufferCompressorTest,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,0x10000);
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8 != (void *)0x0) {
      operator_delete(local_c8,local_b8 - (long)local_c8);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_different_size_buffers_buffer)
{
    for (size_t i = 0; i < 256; i++)
    {
        std::vector<unsigned char> buffer;
        for (unsigned char j = 0; j < i; j++)
        {
            buffer.emplace_back(j);
        }
        TestCompression(buffer, 65536);
        TestCompression(buffer, 8);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
    }
}